

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O1

char * Mio_LibraryCleanStr(char *p)

{
  byte bVar1;
  int iVar2;
  char cVar3;
  size_t sVar4;
  byte *__dest;
  byte *pbVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  bool bVar11;
  
  iVar10 = 0;
  if (p == (char *)0x0) {
    __dest = (byte *)0x0;
  }
  else {
    sVar4 = strlen(p);
    __dest = (byte *)malloc(sVar4 + 1);
    strcpy((char *)__dest,p);
  }
  iVar7 = 0;
  cVar6 = '\0';
  pbVar5 = __dest;
  do {
    bVar1 = *pbVar5;
    uVar8 = (ulong)bVar1;
    iVar2 = 0;
    cVar3 = '\0';
    if (uVar8 < 0x2c) {
      if ((0xfc200000000U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0040604d;
      if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 == 0) {
          __dest[iVar10] = 0;
          return (char *)__dest;
        }
        goto LAB_00406078;
      }
      bVar11 = iVar7 != 0;
      iVar7 = (uint)bVar11 * 2;
      cVar6 = bVar11 * '\x02';
    }
    else {
LAB_00406078:
      if (((bVar1 != 0x5e) && (iVar2 = 0, cVar3 = '\0', bVar1 != 0x7c)) &&
         (iVar2 = 1, cVar3 = '\x01', cVar6 == '\x02')) {
        lVar9 = (long)iVar10;
        iVar10 = iVar10 + 1;
        __dest[lVar9] = 0x20;
      }
LAB_0040604d:
      cVar6 = cVar3;
      iVar7 = iVar2;
      lVar9 = (long)iVar10;
      iVar10 = iVar10 + 1;
      __dest[lVar9] = *pbVar5;
    }
    pbVar5 = pbVar5 + 1;
  } while( true );
}

Assistant:

char * Mio_LibraryCleanStr( char * p )
{
    int i, k;
    int whitespace_state = 0;
    char * pRes = Abc_UtilStrsav( p );
    for ( i = k = 0; pRes[i]; i++ )
        if ( pRes[i] != ' ' && pRes[i] != '\t' && pRes[i] != '\r' && pRes[i] != '\n' ) 
        {
            if ( pRes[i] != '(' && pRes[i] != ')' && pRes[i] != '+' && pRes[i] != '*' && pRes[i] != '|' && pRes[i] != '&' && pRes[i] != '^' && pRes[i] != '\'' && pRes[i] != '!' ) 
            {
                if (whitespace_state == 2)
                    pRes[k++] = ' ';
                whitespace_state = 1;
            } 
            else
                whitespace_state = 0;
            pRes[k++] = pRes[i];
        } 
        else
            whitespace_state = whitespace_state ? 2 : 0;
    pRes[k] = 0;
    return pRes;
}